

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

String * __thiscall
kj::anon_unknown_9::DiskHandle::createNamedTemporary
          (String *__return_storage_ptr__,DiskHandle *this,PathPtr finalName,WriteMode mode,
          Function<int_(kj::StringPtr)> *tryCreate)

{
  Disposer *pDVar1;
  PathPtr finalName_00;
  Fault FVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  String *pSVar7;
  undefined4 extraout_var;
  Exception *pEVar8;
  Iface *pIVar9;
  Function<int_(kj::StringPtr)> *tryCreate_00;
  PathPtr PVar10;
  String pathPrefix;
  Fault f_1;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 uVar11;
  undefined1 uVar12;
  PathPtr local_b8;
  Fault local_a8;
  size_t sStack_a0;
  String *local_98;
  String local_88;
  DiskHandle *local_70;
  ArrayPtr<const_kj::String> local_68;
  Function<int_(kj::StringPtr)> local_58;
  Function<int_(kj::StringPtr)> local_48;
  
  pcVar6 = (char *)finalName.parts.size_;
  local_b8.parts.ptr = finalName.parts.ptr;
  local_b8.parts.size_ = (size_t)pcVar6;
  local_70 = this;
  if (pcVar6 == (char *)0x0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              (&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x388,FAILED,(char *)0x0,"\"can\'t replace self\"",
               (char (*) [19])"can\'t replace self");
    _::Debug::Fault::fatal(&local_a8);
  }
  if ((anonymous_namespace)::DiskHandle::
      createNamedTemporary(kj::PathPtr,kj::WriteMode,kj::Function<int(kj::StringPtr)>)::pid == '\0')
  {
    (anonymous_namespace)::DiskHandle::createNamedTemporary();
  }
  local_a8.exception = (Exception *)0x0;
  sStack_a0 = 0;
  local_98 = (String *)0x0;
  if ((char *)0x1 < local_b8.parts.size_) {
    local_68 = (ArrayPtr<const_kj::String>)PathPtr::parent(&local_b8);
    str<kj::PathPtr,char>(&local_88,(kj *)&local_68,(PathPtr *)&stack0xffffffffffffff46,pcVar6);
    sVar3 = sStack_a0;
    this = (DiskHandle *)local_a8.exception;
    if (local_a8.exception != (Exception *)0x0) {
      local_a8.exception = (Exception *)0x0;
      sStack_a0 = 0;
      (**(code **)(local_98->content).ptr)(local_98,this,1,sVar3,sVar3,0);
    }
    local_a8.exception = (Exception *)local_88.content.ptr;
    sStack_a0 = local_88.content.size_;
    local_98 = (String *)local_88.content.disposer;
  }
  uVar11 = 0x2e;
  local_68.ptr._0_4_ = createNamedTemporary::counter;
  uVar12 = 0x2e;
  createNamedTemporary::counter = createNamedTemporary::counter + 1;
  pcVar6 = PathPtr::basename(&local_b8,(char *)this);
  str<kj::String&,char_const(&)[9],int_const&,char,unsigned_int,char,kj::String_const&,char_const(&)[9]>
            (&local_88,(kj *)&local_a8,(String *)".kj-tmp.",(char (*) [9])&createNamedTemporary::pid
             ,(int *)&stack0xffffffffffffff46,(char *)&local_68,(uint *)&stack0xffffffffffffff47,
             pcVar6,(String *)".partial",
             (char (*) [9])CONCAT17(uVar12,CONCAT16(uVar11,in_stack_ffffffffffffff40)));
  do {
    pEVar8 = (Exception *)0x1f7432;
    if (local_88.content.size_ != 0) {
      pEVar8 = (Exception *)local_88.content.ptr;
    }
    pIVar9 = (tryCreate->impl).ptr;
    iVar5 = (**pIVar9->_vptr_Iface)
                      (pIVar9,pEVar8,local_88.content.size_ + (local_88.content.size_ == 0));
    if (-1 < iVar5) goto LAB_001f08d6;
    iVar5 = _::Debug::getOsErrorNumber(false);
  } while (iVar5 == -1);
  if (iVar5 == 0) {
LAB_001f08d6:
    (__return_storage_ptr__->content).ptr = local_88.content.ptr;
    (__return_storage_ptr__->content).size_ = local_88.content.size_;
    (__return_storage_ptr__->content).disposer = local_88.content.disposer;
    pSVar7 = (String *)local_88.content.disposer;
  }
  else {
    if (iVar5 == 2) {
      if (((mode & CREATE_PARENT) == 0) || (local_b8.parts.size_ < (char *)0x2)) {
LAB_001f09fe:
        _::Debug::Fault::Fault<int,kj::String&>
                  ((Fault *)&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x3a1,iVar5,"create(path)","path",&local_88);
        _::Debug::Fault::fatal((Fault *)&local_68);
      }
      PVar10 = PathPtr::parent(&local_b8);
      bVar4 = tryMkdir(local_70,PVar10,CREATE_PARENT|MODIFY|CREATE,true);
      if (!bVar4) goto LAB_001f09fe;
      PVar10.parts.size_ = local_b8.parts.size_;
      PVar10.parts.ptr = local_b8.parts.ptr;
      local_58.impl.disposer = (tryCreate->impl).disposer;
      local_58.impl.ptr = (tryCreate->impl).ptr;
      tryCreate_00 = &local_58;
      (tryCreate->impl).ptr = (Iface *)0x0;
      pSVar7 = createNamedTemporary
                         (__return_storage_ptr__,local_70,PVar10,mode & ~CREATE_PARENT,tryCreate_00)
      ;
      pIVar9 = local_58.impl.ptr;
    }
    else {
      if (iVar5 != 0x11) goto LAB_001f09fe;
      finalName_00.parts.size_ = local_b8.parts.size_;
      finalName_00.parts.ptr = local_b8.parts.ptr;
      local_48.impl.disposer = (tryCreate->impl).disposer;
      local_48.impl.ptr = (tryCreate->impl).ptr;
      tryCreate_00 = &local_48;
      (tryCreate->impl).ptr = (Iface *)0x0;
      pSVar7 = createNamedTemporary(__return_storage_ptr__,local_70,finalName_00,mode,tryCreate_00);
      pIVar9 = local_48.impl.ptr;
    }
    if (pIVar9 != (Iface *)0x0) {
      (tryCreate_00->impl).ptr = (Iface *)0x0;
      pDVar1 = (tryCreate_00->impl).disposer;
      iVar5 = (**pDVar1->_vptr_Disposer)
                        (pDVar1,pIVar9->_vptr_Iface[-2] + (long)&pIVar9->_vptr_Iface);
      pSVar7 = (String *)CONCAT44(extraout_var,iVar5);
    }
    sVar3 = local_88.content.size_;
    pcVar6 = local_88.content.ptr;
    if ((Exception *)local_88.content.ptr != (Exception *)0x0) {
      local_88.content.ptr = (char *)0x0;
      local_88.content.size_ = 0;
      pSVar7 = (String *)
               (**(code **)((Array<char> *)&(local_88.content.disposer)->_vptr_ArrayDisposer)->ptr)
                         (local_88.content.disposer,pcVar6,1,sVar3,sVar3,0);
    }
  }
  sVar3 = sStack_a0;
  FVar2.exception = local_a8.exception;
  if (local_a8.exception != (Exception *)0x0) {
    local_a8.exception = (Exception *)0x0;
    sStack_a0 = 0;
    pSVar7 = (String *)
             (**(code **)(local_98->content).ptr)(local_98,FVar2.exception,1,sVar3,sVar3,0);
  }
  return pSVar7;
}

Assistant:

String createNamedTemporary(
      PathPtr finalName, WriteMode mode, Function<int(StringPtr)> tryCreate) const {
    // Create a temporary file which will eventually replace `finalName`.
    //
    // Calls `tryCreate` to actually create the temporary, passing in the desired path. tryCreate()
    // is expected to behave like a syscall, returning a negative value and setting `errno` on
    // error. tryCreate() MUST fail with EEXIST if the path exists -- this is not checked in
    // advance, since it needs to be checked atomically. In the case of EEXIST, tryCreate() will
    // be called again with a new path.
    //
    // Returns the temporary path that succeeded.

    if (finalName.size() == 0) {
      KJ_FAIL_REQUIRE("can't replace self");
    }

    static uint counter = 0;
    static const pid_t pid = getpid();
    String pathPrefix;
    if (finalName.size() > 1) {
      pathPrefix = kj::str(finalName.parent(), '/');
    }
    auto path = kj::str(pathPrefix, HIDDEN_PREFIX, pid, '.', counter++, '.',
                        finalName.basename()[0], ".partial");

    KJ_SYSCALL_HANDLE_ERRORS(tryCreate(path)) {
      case EEXIST:
        return createNamedTemporary(finalName, mode, kj::mv(tryCreate));
      case ENOENT:
        if (has(mode, WriteMode::CREATE_PARENT) && finalName.size() > 1 &&
            tryMkdir(finalName.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                         WriteMode::CREATE_PARENT, true)) {
          // Retry, but make sure we don't try to create the parent again.
          mode = mode - WriteMode::CREATE_PARENT;
          return createNamedTemporary(finalName, mode, kj::mv(tryCreate));
        }
        KJ_FALLTHROUGH;
      default:
        KJ_FAIL_SYSCALL("create(path)", error, path);
    }

    return kj::mv(path);
  }